

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestBuildHandler.cxx
# Opt level: O0

void __thiscall cmCTestBuildHandler::GenerateXMLLaunched(cmCTestBuildHandler *this,cmXMLWriter *xml)

{
  bool bVar1;
  ulong uVar2;
  char *fname_00;
  pair<std::_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_bool>
  pVar3;
  _Self local_148;
  _Self local_140;
  const_iterator fi;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  _Base_ptr local_e8;
  undefined1 local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  char *local_98;
  char *fname;
  unsigned_long i;
  unsigned_long n;
  Directory launchDir;
  int local_70;
  int numWarningsAllowed;
  int numErrorsAllowed;
  Fragments fragments;
  FragmentCompare local_28;
  FragmentCompare fragmentCompare;
  cmFileTimeComparison ftc;
  cmXMLWriter *xml_local;
  cmCTestBuildHandler *this_local;
  
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    cmFileTimeComparison::cmFileTimeComparison((cmFileTimeComparison *)&fragmentCompare);
    FragmentCompare::FragmentCompare(&local_28,(cmFileTimeComparison *)&fragmentCompare);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                 *)((long)&numWarningsAllowed + 3));
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestBuildHandler::FragmentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestBuildHandler::FragmentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           *)&numErrorsAllowed,&local_28,
          (allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)((long)&numWarningsAllowed + 3));
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator((allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)((long)&numWarningsAllowed + 3));
    local_70 = this->MaxErrors;
    launchDir.Internal._4_4_ = this->MaxWarnings;
    cmsys::Directory::Directory((Directory *)&n);
    cmsys::Directory::Load((Directory *)&n,&this->CTestLaunchDir);
    i = cmsys::Directory::GetNumberOfFiles((Directory *)&n);
    for (fname = (char *)0x0; fname < i; fname = fname + 1) {
      local_98 = cmsys::Directory::GetFile((Directory *)&n,(unsigned_long)fname);
      bVar1 = IsLaunchedErrorFile(this,local_98);
      if ((bVar1) && (local_70 != 0)) {
        local_70 = local_70 + -1;
        std::operator+(&local_d8,&this->CTestLaunchDir,"/");
        std::operator+(&local_b8,&local_d8,local_98);
        pVar3 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestBuildHandler::FragmentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestBuildHandler::FragmentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&numErrorsAllowed,&local_b8);
        local_e8 = (_Base_ptr)pVar3.first._M_node;
        local_e0 = pVar3.second;
        std::__cxx11::string::~string((string *)&local_b8);
        std::__cxx11::string::~string((string *)&local_d8);
        this->TotalErrors = this->TotalErrors + 1;
      }
      else {
        bVar1 = IsLaunchedWarningFile(this,local_98);
        if ((bVar1) && (launchDir.Internal._4_4_ != 0)) {
          launchDir.Internal._4_4_ = launchDir.Internal._4_4_ + -1;
          std::operator+(&local_128,&this->CTestLaunchDir,"/");
          std::operator+(&local_108,&local_128,local_98);
          pVar3 = std::
                  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestBuildHandler::FragmentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::insert((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestBuildHandler::FragmentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                            *)&numErrorsAllowed,&local_108);
          fi._M_node = (_Base_ptr)pVar3.first._M_node;
          std::__cxx11::string::~string((string *)&local_108);
          std::__cxx11::string::~string((string *)&local_128);
          this->TotalWarnings = this->TotalWarnings + 1;
        }
      }
    }
    local_140._M_node =
         (_Base_ptr)
         std::
         set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestBuildHandler::FragmentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::begin((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestBuildHandler::FragmentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&numErrorsAllowed);
    while( true ) {
      local_148._M_node =
           (_Base_ptr)
           std::
           set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestBuildHandler::FragmentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::end((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestBuildHandler::FragmentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&numErrorsAllowed);
      bVar1 = std::operator!=(&local_140,&local_148);
      if (!bVar1) break;
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator->(&local_140);
      fname_00 = (char *)std::__cxx11::string::c_str();
      cmXMLWriter::FragmentFile(xml,fname_00);
      std::
      _Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator++(&local_140);
    }
    cmsys::Directory::~Directory((Directory *)&n);
    std::
    set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestBuildHandler::FragmentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmCTestBuildHandler::FragmentCompare,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)&numErrorsAllowed);
    cmFileTimeComparison::~cmFileTimeComparison((cmFileTimeComparison *)&fragmentCompare);
  }
  return;
}

Assistant:

void cmCTestBuildHandler::GenerateXMLLaunched(cmXMLWriter& xml)
{
  if(this->CTestLaunchDir.empty())
    {
    return;
    }

  // Sort XML fragments in chronological order.
  cmFileTimeComparison ftc;
  FragmentCompare fragmentCompare(&ftc);
  typedef std::set<std::string, FragmentCompare> Fragments;
  Fragments fragments(fragmentCompare);

  // only report the first 50 warnings and first 50 errors
  int numErrorsAllowed = this->MaxErrors;
  int numWarningsAllowed = this->MaxWarnings;
  // Identify fragments on disk.
  cmsys::Directory launchDir;
  launchDir.Load(this->CTestLaunchDir);
  unsigned long n = launchDir.GetNumberOfFiles();
  for(unsigned long i=0; i < n; ++i)
    {
    const char* fname = launchDir.GetFile(i);
    if(this->IsLaunchedErrorFile(fname) && numErrorsAllowed)
      {
      numErrorsAllowed--;
      fragments.insert(this->CTestLaunchDir + "/" + fname);
      ++this->TotalErrors;
      }
    else if(this->IsLaunchedWarningFile(fname) && numWarningsAllowed)
      {
      numWarningsAllowed--;
      fragments.insert(this->CTestLaunchDir + "/" + fname);
      ++this->TotalWarnings;
      }
    }

  // Copy the fragments into the final XML file.
  for(Fragments::const_iterator fi = fragments.begin();
      fi != fragments.end(); ++fi)
    {
    xml.FragmentFile(fi->c_str());
    }
}